

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_manager.hpp
# Opt level: O0

pair<std::error_code,_std::shared_ptr<ylt::metric::basic_static_counter<long>_>_> * __thiscall
ylt::metric::static_metric_manager<my_tag>::
create_metric_static<ylt::metric::basic_static_counter<long>>
          (static_metric_manager<my_tag> *this,string *name,string *help)

{
  byte bVar1;
  pair<std::error_code,_std::shared_ptr<ylt::metric::basic_static_counter<long>_>_> *in_RDI;
  bool r;
  shared_ptr<ylt::metric::basic_static_counter<long>_> m;
  pair<std::error_code,_std::nullptr_t> *in_stack_ffffffffffffff28;
  pair<std::error_code,_std::shared_ptr<ylt::metric::basic_static_counter<long>_>_> *__x;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff50;
  undefined7 in_stack_ffffffffffffff58;
  undefined1 in_stack_ffffffffffffff5f;
  static_metric_manager<my_tag> *in_stack_ffffffffffffff60;
  
  __x = in_RDI;
  std::
  make_shared<ylt::metric::basic_static_counter<long>,std::__cxx11::string_const&,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58),in_stack_ffffffffffffff50
            );
  std::shared_ptr<ylt::metric::static_metric>::
  shared_ptr<ylt::metric::basic_static_counter<long>,void>
            ((shared_ptr<ylt::metric::static_metric> *)in_RDI,
             (shared_ptr<ylt::metric::basic_static_counter<long>_> *)in_stack_ffffffffffffff28);
  bVar1 = register_metric(in_stack_ffffffffffffff60,
                          (shared_ptr<ylt::metric::static_metric> *)
                          CONCAT17(in_stack_ffffffffffffff5f,in_stack_ffffffffffffff58));
  std::shared_ptr<ylt::metric::static_metric>::~shared_ptr
            ((shared_ptr<ylt::metric::static_metric> *)0x199fbc);
  if ((bVar1 & 1) == 0) {
    std::make_error_code(0);
    std::make_pair<std::error_code,decltype(nullptr)>
              (&in_RDI->first,(void **)in_stack_ffffffffffffff28);
    std::pair<std::error_code,_std::shared_ptr<ylt::metric::basic_static_counter<long>_>_>::
    pair<std::error_code,_std::nullptr_t,_true>(in_RDI,in_stack_ffffffffffffff28);
  }
  else {
    std::error_code::error_code(&in_RDI->first);
    std::make_pair<std::error_code,std::shared_ptr<ylt::metric::basic_static_counter<long>>&>
              (&__x->first,(shared_ptr<ylt::metric::basic_static_counter<long>_> *)in_RDI);
  }
  std::shared_ptr<ylt::metric::basic_static_counter<long>_>::~shared_ptr
            ((shared_ptr<ylt::metric::basic_static_counter<long>_> *)0x19a098);
  return __x;
}

Assistant:

std::pair<std::error_code, std::shared_ptr<T>> create_metric_static(
      const std::string& name, const std::string& help, Args&&... args) {
    auto m = std::make_shared<T>(name, help, std::forward<Args>(args)...);
    bool r = register_metric(m);
    if (!r) {
      return std::make_pair(std::make_error_code(std::errc::invalid_argument),
                            nullptr);
    }

    return std::make_pair(std::error_code{}, m);
  }